

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O2

SUNErrCode SUNMatCopy_Sparse(SUNMatrix A,SUNMatrix B)

{
  long lVar1;
  void *pvVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  
  lVar1 = *(long *)(*(long *)((long)A->content + 0x38) + *(long *)((long)A->content + 0x18) * 8);
  if (*(long *)((long)B->content + 0x10) < lVar1) {
    pvVar3 = realloc(*(void **)((long)B->content + 0x30),lVar1 * 8);
    pvVar2 = B->content;
    *(void **)((long)pvVar2 + 0x30) = pvVar3;
    pvVar3 = realloc(*(void **)((long)pvVar2 + 0x20),lVar1 * 8);
    pvVar2 = B->content;
    *(void **)((long)pvVar2 + 0x20) = pvVar3;
    *(long *)((long)pvVar2 + 0x10) = lVar1;
  }
  SUNMatZero_Sparse(B);
  lVar4 = 0;
  lVar5 = 0;
  if (0 < lVar1) {
    lVar5 = lVar1;
  }
  pvVar2 = A->content;
  for (; lVar5 != lVar4; lVar4 = lVar4 + 1) {
    pvVar3 = B->content;
    *(undefined8 *)(*(long *)((long)pvVar3 + 0x20) + lVar4 * 8) =
         *(undefined8 *)(*(long *)((long)pvVar2 + 0x20) + lVar4 * 8);
    *(undefined8 *)(*(long *)((long)pvVar3 + 0x30) + lVar4 * 8) =
         *(undefined8 *)(*(long *)((long)pvVar2 + 0x30) + lVar4 * 8);
  }
  for (lVar5 = 0; lVar5 < *(long *)((long)pvVar2 + 0x18); lVar5 = lVar5 + 1) {
    *(undefined8 *)(*(long *)((long)B->content + 0x38) + lVar5 * 8) =
         *(undefined8 *)(*(long *)((long)pvVar2 + 0x38) + lVar5 * 8);
  }
  *(long *)(*(long *)((long)B->content + 0x38) + *(long *)((long)pvVar2 + 0x18) * 8) = lVar1;
  return 0;
}

Assistant:

SUNErrCode SUNMatCopy_Sparse(SUNMatrix A, SUNMatrix B)
{
  sunindextype i, A_nz;
  SUNFunctionBegin(A->sunctx);

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_SPARSE, SUN_ERR_ARG_WRONGTYPE);
  SUNAssert(SUNMatGetID(B) == SUNMATRIX_SPARSE, SUN_ERR_ARG_WRONGTYPE);
  SUNCheck(compatibleMatrices(A, B), SUN_ERR_ARG_DIMSMISMATCH);

  /* Perform operation */
  A_nz = (SM_INDEXPTRS_S(A))[SM_NP_S(A)];

  /* ensure that B is allocated with at least as
     much memory as we have nonzeros in A */
  if (SM_NNZ_S(B) < A_nz)
  {
    SM_INDEXVALS_S(B) = (sunindextype*)realloc(SM_INDEXVALS_S(B),
                                               A_nz * sizeof(sunindextype));
    SUNAssert(SM_INDEXVALS_S(B), SUN_ERR_MALLOC_FAIL);

    SM_DATA_S(B) = (sunrealtype*)realloc(SM_DATA_S(B),
                                         A_nz * sizeof(sunrealtype));
    SUNAssert(SM_DATA_S(B), SUN_ERR_MALLOC_FAIL);

    SM_NNZ_S(B) = A_nz;
  }

  /* zero out B so that copy works correctly */
  SUNCheckCall(SUNMatZero_Sparse(B));

  /* copy the data and row indices over */
  for (i = 0; i < A_nz; i++)
  {
    (SM_DATA_S(B))[i]      = (SM_DATA_S(A))[i];
    (SM_INDEXVALS_S(B))[i] = (SM_INDEXVALS_S(A))[i];
  }

  /* copy the column pointers over */
  for (i = 0; i < SM_NP_S(A); i++)
  {
    (SM_INDEXPTRS_S(B))[i] = (SM_INDEXPTRS_S(A))[i];
  }
  (SM_INDEXPTRS_S(B))[SM_NP_S(A)] = A_nz;

  return SUN_SUCCESS;
}